

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdcolmap.c
# Opt level: O2

void read_color_map(j_decompress_ptr cinfo,FILE *infile)

{
  jpeg_error_mgr *pjVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int B;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint R;
  uint G;
  uint B_00;
  JSAMPARRAY ppJVar8;
  uint uVar9;
  long lVar10;
  bool bVar11;
  int aiStack_68 [10];
  byte local_40;
  
  ppJVar8 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,0x100,3);
  cinfo->colormap = ppJVar8;
  cinfo->actual_number_of_colors = 0;
  iVar2 = getc((FILE *)infile);
  if (iVar2 == 0x50) {
    iVar2 = getc((FILE *)infile);
    uVar5 = read_pbm_integer(cinfo,infile);
    uVar6 = read_pbm_integer(cinfo,infile);
    uVar7 = read_pbm_integer(cinfo,infile);
    if (uVar7 == 0 || (uVar6 == 0 || uVar5 == 0)) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 0x412;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
    }
    if (uVar7 != 0xff) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 0x412;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
    }
    if (iVar2 == 0x33) {
      for (uVar7 = 0; uVar9 = uVar5, uVar7 != uVar6; uVar7 = uVar7 + 1) {
        while (uVar9 != 0) {
          R = read_pbm_integer(cinfo,infile);
          G = read_pbm_integer(cinfo,infile);
          B_00 = read_pbm_integer(cinfo,infile);
          add_map_entry(cinfo,R,G,B_00);
          uVar9 = uVar9 - 1;
        }
      }
    }
    else {
      if (iVar2 != 0x36) goto LAB_00103d94;
      for (uVar7 = 0; uVar9 = uVar5, uVar7 != uVar6; uVar7 = uVar7 + 1) {
        while (uVar9 != 0) {
          iVar2 = getc((FILE *)infile);
          iVar3 = getc((FILE *)infile);
          iVar4 = getc((FILE *)infile);
          if ((iVar3 == -1 || iVar2 == -1) || iVar4 == -1) {
            pjVar1 = cinfo->err;
            pjVar1->msg_code = 0x412;
            (*pjVar1->error_exit)((j_common_ptr)cinfo);
          }
          add_map_entry(cinfo,iVar2,iVar3,iVar4);
          uVar9 = uVar9 - 1;
        }
      }
    }
  }
  else {
    if (iVar2 != 0x47) {
LAB_00103d94:
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 0x412;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
      return;
    }
    for (lVar10 = 1; lVar10 != 0xd; lVar10 = lVar10 + 1) {
      iVar2 = getc((FILE *)infile);
      aiStack_68[lVar10] = iVar2;
      if (iVar2 == -1) {
        pjVar1 = cinfo->err;
        pjVar1->msg_code = 0x412;
        (*pjVar1->error_exit)((j_common_ptr)cinfo);
      }
    }
    if ((aiStack_68[1] != 0x49) || (aiStack_68[2] != 0x46)) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 0x412;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
    }
    if (-1 < (char)local_40) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 0x412;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
    }
    iVar2 = 2 << (local_40 & 7);
    while (bVar11 = iVar2 != 0, iVar2 = iVar2 + -1, bVar11) {
      iVar3 = getc((FILE *)infile);
      iVar4 = getc((FILE *)infile);
      B = getc((FILE *)infile);
      if ((iVar4 == -1 || iVar3 == -1) || B == -1) {
        pjVar1 = cinfo->err;
        pjVar1->msg_code = 0x412;
        (*pjVar1->error_exit)((j_common_ptr)cinfo);
      }
      add_map_entry(cinfo,iVar3,iVar4,B);
    }
  }
  return;
}

Assistant:

GLOBAL(void)
read_color_map(j_decompress_ptr cinfo, FILE *infile)
{
  /* Allocate space for a color map of maximum supported size. */
  cinfo->colormap = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE,
     (JDIMENSION)(MAXJSAMPLE + 1), (JDIMENSION)3);
  cinfo->actual_number_of_colors = 0; /* initialize map to empty */

  /* Read first byte to determine file format */
  switch (getc(infile)) {
  case 'G':
    read_gif_map(cinfo, infile);
    break;
  case 'P':
    read_ppm_map(cinfo, infile);
    break;
  default:
    ERREXIT(cinfo, JERR_BAD_CMAP_FILE);
    break;
  }
}